

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O3

int streamConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  mpt_type_t mVar3;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    mVar3 = 0x100;
  }
  else {
    mVar3 = pmVar2->type;
    if (mVar3 == type) goto LAB_001072ec;
  }
  if (type != 0x100) {
    if (type == 1) {
      if (ptr != (void *)0x0) {
        iVar1 = _mpt_stream_fread((mpt_streaminfo *)(val + 2));
        *(int *)ptr = iVar1;
      }
    }
    else {
      if (type != 0) {
        return -3;
      }
      if (ptr != (void *)0x0) {
        *(char **)ptr = "\x01";
      }
    }
    return (int)mVar3;
  }
LAB_001072ec:
  if (ptr != (void *)0x0) {
    *(mpt_convertable **)ptr = val;
  }
  return 1;
}

Assistant:

static int streamConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(streamInput) *srm = (void *) val;
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((void **) ptr) = &srm->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeUnixSocket), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = &srm->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((int *) ptr) = _mpt_stream_fread(&srm->data._info);
		return me;
	}
	return MPT_ERROR(BadType);
}